

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_cleanup(archive_read *a)

{
  archive_string *as;
  void *pvVar1;
  void *__ptr;
  
  as = (archive_string *)a->format->data;
  if ((char)as[0xc].length != '\0') {
    inflateEnd(&as[7].buffer_length);
  }
  if ((char)as[0x12].length != '\0') {
    lzma_end(&as[0xc].buffer_length);
  }
  if (*(char *)&as[0x13].s != '\0') {
    ZSTD_freeDStream(as[0x12].buffer_length);
  }
  free(as[7].s);
  if ((char)as[0x148].length != '\0') {
    Ppmd8_Free((CPpmd8 *)&as[0x14].length);
  }
  __ptr = (void *)as[2].buffer_length;
  if ((void *)as[2].buffer_length != (void *)0x0) {
    while (__ptr != (void *)0x0) {
      pvVar1 = *(void **)((long)__ptr + 0x18);
      archive_string_free((archive_string *)((long)__ptr + 0x48));
      free(__ptr);
      __ptr = pvVar1;
    }
  }
  free((void *)as[0x14a].length);
  if ((char)as[0x150].length != '\0') {
    aes_ctr_release((archive_crypto_ctx *)&as[0x14c].buffer_length);
  }
  if (*(char *)&as[0x151].s != '\0') {
    __hmac_sha1_cleanup((archive_hmac_sha1_ctx *)&as[0x150].buffer_length);
  }
  free((void *)as[0x152].length);
  free((void *)as[0x152].buffer_length);
  free(as[0x153].s);
  archive_string_free(as);
  free(as);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_zip_cleanup(struct archive_read *a)
{
	struct zip *zip;
	struct zip_entry *zip_entry, *next_zip_entry;

	zip = (struct zip *)(a->format->data);

#ifdef HAVE_ZLIB_H
	if (zip->stream_valid)
		inflateEnd(&zip->stream);
#endif

#if HAVE_LZMA_H && HAVE_LIBLZMA
    if (zip->zipx_lzma_valid) {
		lzma_end(&zip->zipx_lzma_stream);
	}
#endif

#ifdef HAVE_BZLIB_H
	if (zip->bzstream_valid) {
		BZ2_bzDecompressEnd(&zip->bzstream);
	}
#endif

#if HAVE_ZSTD_H && HAVE_LIBZSTD
	if (zip->zstdstream_valid) {
		ZSTD_freeDStream(zip->zstdstream);
	}
#endif

	free(zip->uncompressed_buffer);

	if (zip->ppmd8_valid)
		__archive_ppmd8_functions.Ppmd8_Free(&zip->ppmd8);

	if (zip->zip_entries) {
		zip_entry = zip->zip_entries;
		while (zip_entry != NULL) {
			next_zip_entry = zip_entry->next;
			archive_string_free(&zip_entry->rsrcname);
			free(zip_entry);
			zip_entry = next_zip_entry;
		}
	}
	free(zip->decrypted_buffer);
	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	free(zip->iv);
	free(zip->erd);
	free(zip->v_data);
	archive_string_free(&zip->format_name);
	free(zip);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}